

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall S2BooleanOperation::Impl::GetIndexCrossings(Impl *this,int region_id)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pIVar5;
  bool bVar6;
  int iVar7;
  IndexCrossing *crossing;
  long lVar8;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  __first;
  pointer pIVar9;
  undefined1 auVar10 [16];
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  iVar7 = this->index_crossings_first_region_id_;
  if (iVar7 != region_id) {
    if (iVar7 < 0) {
      if (region_id != 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x776,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)local_40._8_8_,"Check failed: (region_id) == (0) ");
        abort();
      }
      local_40._8_8_ = 0;
      local_28 = std::
                 _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1914:13)>
                 ::_M_invoke;
      local_30 = std::
                 _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1914:13)>
                 ::_M_manager;
      local_40._M_unused._M_object = this;
      bVar6 = s2shapeutil::VisitCrossingEdgePairs
                        (this->op_->regions_[0],this->op_->regions_[1],ALL,
                         (EdgePairVisitor *)&local_40);
      std::_Function_base::~_Function_base((_Function_base *)&local_40);
      if (!bVar6) {
        return false;
      }
      pIVar9 = (this->index_crossings_).
               super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar5 = (this->index_crossings_).
               super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = (long)pIVar5 - (long)pIVar9;
      if (1 < (ulong)(lVar8 / 0x14)) {
        std::
        __sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pIVar9,pIVar5,lVar8 % 0x14);
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            ((this->index_crossings_).
                             super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->index_crossings_).
                             super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
        ::erase(&this->index_crossings_,(const_iterator)__first._M_current,
                (this->index_crossings_).
                super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_40._M_unused._M_object = (void *)kSentinel;
      local_40._8_4_ = kSentinel.shape_id;
      local_40._12_4_ = kSentinel.edge_id;
      local_30 = (code *)((ulong)local_30 & 0xffffffffffffff00);
      std::
      vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
      ::emplace_back<S2BooleanOperation::Impl::IndexCrossing>
                (&this->index_crossings_,(IndexCrossing *)&local_40);
      this->index_crossings_first_region_id_ = 0;
      iVar7 = 0;
    }
    if (iVar7 != region_id) {
      pIVar5 = (this->index_crossings_).
               super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar9 = (this->index_crossings_).
                    super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                    ._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar5; pIVar9 = pIVar9 + 1
          ) {
        uVar1 = (pIVar9->a).shape_id;
        uVar2 = (pIVar9->a).edge_id;
        uVar3 = (pIVar9->b).shape_id;
        uVar4 = (pIVar9->b).edge_id;
        auVar10._4_4_ = uVar4;
        auVar10._0_4_ = uVar3;
        auVar10._8_4_ = uVar1;
        auVar10._12_4_ = uVar2;
        (pIVar9->a).shape_id = uVar3;
        (pIVar9->a).edge_id = uVar4;
        (pIVar9->b).shape_id = (int)auVar10._8_8_;
        (pIVar9->b).edge_id = (int)((ulong)auVar10._8_8_ >> 0x20);
        pIVar9->field_0x10 = pIVar9->field_0x10 ^ 6;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->index_crossings_).
                 super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->index_crossings_).
                 super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      this->index_crossings_first_region_id_ = region_id;
    }
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::GetIndexCrossings(int region_id) {
  if (region_id == index_crossings_first_region_id_) return true;
  if (index_crossings_first_region_id_ < 0) {
    S2_DCHECK_EQ(region_id, 0);  // For efficiency, not correctness.
    if (!s2shapeutil::VisitCrossingEdgePairs(
            *op_->regions_[0], *op_->regions_[1],
            s2shapeutil::CrossingType::ALL,
            [this](const ShapeEdge& a, const ShapeEdge& b, bool is_interior) {
              // For all supported operations (union, intersection, and
              // difference), if the input edges have an interior crossing
              // then the output is guaranteed to have at least one edge.
              if (is_interior && is_boolean_output()) return false;
              return AddIndexCrossing(a, b, is_interior, &index_crossings_);
            })) {
      return false;
    }
    if (index_crossings_.size() > 1) {
      std::sort(index_crossings_.begin(), index_crossings_.end());
      index_crossings_.erase(
          std::unique(index_crossings_.begin(), index_crossings_.end()),
          index_crossings_.end());
    }
    // Add a sentinel value to simplify the loop logic.
    index_crossings_.push_back(IndexCrossing(kSentinel, kSentinel));
    index_crossings_first_region_id_ = 0;
  }
  if (region_id != index_crossings_first_region_id_) {
    for (auto& crossing : index_crossings_) {
      swap(crossing.a, crossing.b);
      // The following predicates get inverted when the edges are swapped.
      crossing.left_to_right ^= true;
      crossing.is_vertex_crossing ^= true;
    }
    std::sort(index_crossings_.begin(), index_crossings_.end());
    index_crossings_first_region_id_ = region_id;
  }
  return true;
}